

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_arg.hpp
# Opt level: O0

void __thiscall Args::MultiArg::process(MultiArg *this,Context *context)

{
  bool on;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Arg *in_RDI;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  allocator local_71;
  string local_70 [24];
  CmdLine *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  Context *in_stack_ffffffffffffffc0;
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  uVar1 = (*(in_RDI->super_ArgIface)._vptr_ArgIface[4])();
  if ((uVar1 & 1) == 0) {
    Arg::setDefined(in_RDI,true);
    *(long *)&in_RDI[1].m_value = *(long *)&in_RDI[1].m_value + 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Argument \"",&local_71);
    (*(in_RDI->super_ArgIface)._vptr_ArgIface[3])(local_a8);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(local_10,(char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    ArgIface::cmdLine(&in_RDI->super_ArgIface);
    on = eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffa8);
    Arg::setDefined(in_RDI,on);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return;
}

Assistant:

inline void
MultiArg::process( Context & context )
{
	if( isWithValue() )
	{
		setDefined( eatValues( context, m_values,
			String( SL( "Argument \"" ) ) +
				name() + SL( "\" requires value that wasn't presented." ),
			cmdLine() ) );
	}
	else
	{
		setDefined( true );

		++m_count;
	}
}